

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void __thiscall Assimp::IFC::TempMesh::RemoveAdjacentDuplicates(TempMesh *this)

{
  uint uVar1;
  bool bVar2;
  reference puVar3;
  reference paVar4;
  difference_type dVar5;
  reference b;
  double dVar6;
  bool local_119;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_108;
  const_iterator local_100;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_f8;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_f0;
  aiVector3t<double> *local_e8;
  const_iterator local_e0;
  const_iterator local_d8;
  aiVector3t<double> *local_d0;
  aiVector3t<double> *local_c8;
  aiVector3t<double> *local_c0;
  aiVector3t<double> *local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b0;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_a8;
  iterator e;
  iterator end;
  FuzzyVectorCompare fz;
  IfcFloat epsilon;
  IfcVector3 vmax;
  IfcVector3 vmin;
  uint *cnt;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  iterator base;
  bool drop;
  TempMesh *this_local;
  
  base._M_current._7_1_ = 0;
  __range2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                       (&this->mVerts);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->mVertcnt);
  cnt = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->mVertcnt);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&cnt);
    if (!bVar2) {
      if ((base._M_current._7_1_ & 1) != 0) {
        LogFunctions<Assimp::IFCImporter>::LogDebug("removing duplicate vertices");
      }
      return;
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    if (*puVar3 < 2) {
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
      ::operator+=((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    *)&__range2,(ulong)*puVar3);
    }
    else {
      aiVector3t<double>::aiVector3t((aiVector3t<double> *)&vmax.z);
      aiVector3t<double>::aiVector3t((aiVector3t<double> *)&epsilon);
      paVar4 = __gnu_cxx::
               __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
               ::operator*((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                            *)&__range2);
      ArrayBounds<aiVector3t<double>>
                (paVar4,*puVar3,(aiVector3t<double> *)&vmax.z,(aiVector3t<double> *)&epsilon);
      ::operator-((aiVector3t<double> *)&fz,(aiVector3t<double> *)&epsilon,
                  (aiVector3t<double> *)&vmax.z);
      dVar6 = aiVector3t<double>::SquareLength((aiVector3t<double> *)&fz);
      FuzzyVectorCompare::FuzzyVectorCompare((FuzzyVectorCompare *)&end,dVar6 / 1000000000.0);
      local_b8 = (aiVector3t<double> *)
                 __gnu_cxx::
                 __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                 ::operator+((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                              *)&__range2,(ulong)*puVar3);
      local_b0 = __range2;
      local_c0 = end._M_current;
      e._M_current = local_b8;
      local_a8 = std::
                 unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,Assimp::IFC::FuzzyVectorCompare>
                           ((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                             )__range2,
                            (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                             )local_b8,end._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_a8,&e);
      if (bVar2) {
        local_c8 = local_a8._M_current;
        local_d0 = e._M_current;
        dVar5 = std::
                distance<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                          (local_a8,(__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                     )e._M_current);
        *puVar3 = *puVar3 - (int)dVar5;
        __gnu_cxx::
        __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
        ::__normal_iterator<aiVector3t<double>*>
                  ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                    *)&local_d8,&local_a8);
        __gnu_cxx::
        __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
        ::__normal_iterator<aiVector3t<double>*>
                  ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                    *)&local_e0,&e);
        local_e8 = (aiVector3t<double> *)
                   std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                             (&this->mVerts,local_d8,local_e0);
        base._M_current._7_1_ = 1;
      }
      local_119 = false;
      if (1 < *puVar3) {
        paVar4 = __gnu_cxx::
                 __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                 ::operator*((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                              *)&__range2);
        local_f8 = __gnu_cxx::
                   __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                   ::operator+((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                *)&__range2,(ulong)*puVar3);
        local_f0 = __gnu_cxx::
                   __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                   ::operator-(&local_f8,1);
        b = __gnu_cxx::
            __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
            ::operator*(&local_f0);
        local_119 = FuzzyVectorCompare::operator()((FuzzyVectorCompare *)&end,paVar4,b);
      }
      if (local_119 != false) {
        uVar1 = *puVar3;
        *puVar3 = uVar1 - 1;
        local_108 = __gnu_cxx::
                    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    ::operator+((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                 *)&__range2,(ulong)(uVar1 - 1));
        __gnu_cxx::
        __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
        ::__normal_iterator<aiVector3t<double>*>
                  ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                    *)&local_100,&local_108);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                  (&this->mVerts,local_100);
        base._M_current._7_1_ = 1;
      }
      if (*puVar3 == 0) {
        __assert_fail("cnt>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCUtil.cpp"
                      ,0x1b3,"void Assimp::IFC::TempMesh::RemoveAdjacentDuplicates()");
      }
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
      ::operator+=((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    *)&__range2,(ulong)*puVar3);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

void TempMesh::RemoveAdjacentDuplicates() {
    bool drop = false;
    std::vector<IfcVector3>::iterator base = mVerts.begin();
    for(unsigned int& cnt : mVertcnt) {
        if (cnt < 2){
            base += cnt;
            continue;
        }

        IfcVector3 vmin,vmax;
        ArrayBounds(&*base, cnt ,vmin,vmax);


        const IfcFloat epsilon = (vmax-vmin).SquareLength() / static_cast<IfcFloat>(1e9);
        //const IfcFloat dotepsilon = 1e-9;

        //// look for vertices that lie directly on the line between their predecessor and their
        //// successor and replace them with either of them.

        //for(size_t i = 0; i < cnt; ++i) {
        //  IfcVector3& v1 = *(base+i), &v0 = *(base+(i?i-1:cnt-1)), &v2 = *(base+(i+1)%cnt);
        //  const IfcVector3& d0 = (v1-v0), &d1 = (v2-v1);
        //  const IfcFloat l0 = d0.SquareLength(), l1 = d1.SquareLength();
        //  if (!l0 || !l1) {
        //      continue;
        //  }

        //  const IfcFloat d = (d0/std::sqrt(l0))*(d1/std::sqrt(l1));

        //  if ( d >= 1.f-dotepsilon ) {
        //      v1 = v0;
        //  }
        //  else if ( d < -1.f+dotepsilon ) {
        //      v2 = v1;
        //      continue;
        //  }
        //}

        // drop any identical, adjacent vertices. this pass will collect the dropouts
        // of the previous pass as a side-effect.
        FuzzyVectorCompare fz(epsilon);
        std::vector<IfcVector3>::iterator end = base+cnt, e = std::unique( base, end, fz );
        if (e != end) {
            cnt -= static_cast<unsigned int>(std::distance(e, end));
            mVerts.erase(e,end);
            drop  = true;
        }

        // check front and back vertices for this polygon
        if (cnt > 1 && fz(*base,*(base+cnt-1))) {
            mVerts.erase(base+ --cnt);
            drop  = true;
        }

        // removing adjacent duplicates shouldn't erase everything :-)
        ai_assert(cnt>0);
        base += cnt;
    }
    if(drop) {
        IFCImporter::LogDebug("removing duplicate vertices");
    }
}